

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

ON_PlaneSurface * __thiscall ON_PlaneSurface::operator=(ON_PlaneSurface *this,ON_Plane *src)

{
  long lVar1;
  ON_Plane *pOVar2;
  
  pOVar2 = &this->m_plane;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar2->origin).x = (src->origin).x;
    src = (ON_Plane *)&(src->origin).y;
    pOVar2 = (ON_Plane *)&(pOVar2->origin).y;
  }
  ON_Interval::Set((ON_Interval *)&this->field_0x90,0.0,1.0);
  ON_Interval::Set((ON_Interval *)&this->field_0xa0,0.0,1.0);
  *(undefined8 *)&this->field_0xb0 = *(undefined8 *)&this->field_0x90;
  *(undefined8 *)&this->field_0xb8 = *(undefined8 *)&this->field_0x98;
  *(undefined8 *)&this->field_0xc0 = *(undefined8 *)&this->field_0xa0;
  *(undefined8 *)&this->field_0xc8 = *(undefined8 *)&this->field_0xa8;
  return this;
}

Assistant:

ON_PlaneSurface& ON_PlaneSurface::operator=( const ON_Plane& src )
{
  m_plane = src;
  m_domain[0].Set(0.0,1.0);
  m_domain[1].Set(0.0,1.0);
  m_extents[0] = m_domain[0];
  m_extents[1] = m_domain[1];
  return *this;
}